

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  string ruleVar;
  string sStack_58;
  string local_38;
  
  psVar2 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  psVar2 = &(this->super_cmCommonTargetGenerator).ConfigName;
  bVar1 = cmGeneratorTarget::HasImplibGNUtoMS
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,psVar2);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_58,"CMAKE_",(allocator<char> *)&local_38);
    cmGeneratorTarget::GetLinkerLanguage
              (&local_38,(this->super_cmCommonTargetGenerator).GeneratorTarget,psVar2);
    std::__cxx11::string::append((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::append((char *)&sStack_58);
    pcVar3 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&sStack_58);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->ConfigName)) {
    std::string ruleVar = "CMAKE_";
    ruleVar += this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    ruleVar += "_GNUtoMS_RULE";
    if (const char* rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += rule;
    }
  }
  return linkRule;
}